

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

string * __thiscall
Assimp::Importer::GetPropertyString
          (string *__return_storage_ptr__,Importer *this,char *szName,string *iErrorReturn)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *iErrorReturn_local;
  char *szName_local;
  Importer *this_local;
  
  pbVar1 = GetGenericProperty<std::__cxx11::string>
                     (&this->pimpl->mStringProperties,szName,iErrorReturn);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
  return __return_storage_ptr__;
}

Assistant:

const std::string Importer::GetPropertyString(const char* szName,
    const std::string& iErrorReturn /*= ""*/) const
{
    return GetGenericProperty<std::string>(pimpl->mStringProperties,szName,iErrorReturn);
}